

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slider.cpp
# Opt level: O3

void __thiscall QtMWidgets::Slider::Slider(Slider *this,Orientation orientation,QWidget *parent)

{
  SliderPrivate *pSVar1;
  EVP_PKEY_CTX *ctx;
  
  ctx = (EVP_PKEY_CTX *)(ulong)orientation;
  QAbstractSlider::QAbstractSlider(&this->super_QAbstractSlider,parent);
  *(undefined ***)this = &PTR_metaObject_0019bdb8;
  *(undefined ***)&this->field_0x10 = &PTR__Slider_0019bf70;
  pSVar1 = (SliderPrivate *)operator_new(0x28);
  pSVar1->q = this;
  pSVar1->radius = 0;
  pSVar1->grooveHeight = 2;
  pSVar1->pressedControl = SC_None;
  pSVar1->clickOffset = 0;
  (pSVar1->highlightColor).cspec = Invalid;
  (pSVar1->highlightColor).ct.argb.alpha = 0xffff;
  *(undefined8 *)((long)&(pSVar1->highlightColor).ct + 2) = 0;
  (this->d).d = pSVar1;
  QAbstractSlider::setOrientation((Orientation)this);
  SliderPrivate::init((this->d).d,ctx);
  return;
}

Assistant:

Slider::Slider( Qt::Orientation orientation, QWidget * parent )
	:	QAbstractSlider( parent )
	,	d( new SliderPrivate( this ) )
{
	setOrientation( orientation );
	d->init();
}